

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall
efsw::FileWatcherInotify::FileWatcherInotify(FileWatcherInotify *this,FileWatcher *parent)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  FileWatcherImpl::FileWatcherImpl(&this->super_FileWatcherImpl,parent);
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_00134c38;
  p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header;
  (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mWatchesRef)._M_h._M_buckets = &(this->mWatchesRef)._M_h._M_single_bucket;
  (this->mWatchesRef)._M_h._M_bucket_count = 1;
  (this->mWatchesRef)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mWatchesRef)._M_h._M_element_count = 0;
  (this->mWatchesRef)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mWatchesRef)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mWatchesRef)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->mFD = -1;
  this->mThread = (Thread *)0x0;
  Mutex::Mutex(&this->mWatchesLock);
  Mutex::Mutex(&this->mRealWatchesLock);
  Mutex::Mutex(&this->mInitLock);
  this->mIsTakingAction = false;
  (this->mMovedOutsideWatches).
  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMovedOutsideWatches).
  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mMovedOutsideWatches).
  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = inotify_init();
  this->mFD = iVar2;
  if (-1 < iVar2) {
    (this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i = true;
  }
  return;
}

Assistant:

FileWatcherInotify::FileWatcherInotify( FileWatcher* parent ) :
	FileWatcherImpl( parent ), mFD( -1 ), mThread( NULL ), mIsTakingAction( false ) {
	mFD = inotify_init();

	if ( mFD < 0 ) {
		efDEBUG( "Error: %s\n", strerror( errno ) );
	} else {
		mInitOK = true;
	}
}